

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_safe_forceExtDict
              (char *source,char *dest,int compressedSize,int maxOutputSize,char *dictStart,
              int dictSize)

{
  char *pcVar1;
  char cVar2;
  long lVar3;
  ushort uVar4;
  ushort uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  BYTE *s_2;
  ulong __n;
  char *pcVar8;
  char *pcVar9;
  uint uVar10;
  ushort *puVar11;
  size_t __n_00;
  ulong uVar12;
  ushort *puVar13;
  char *pcVar14;
  ushort *__src;
  long lVar15;
  BYTE *d;
  char *pcVar16;
  char *pcVar17;
  BYTE *d_1;
  char *__dest;
  ulong __n_01;
  bool bVar18;
  int local_b8;
  long local_78 [9];
  
  local_78[2] = 0;
  local_78[4] = 0;
  local_78[0] = 0;
  local_78[1] = 0;
  local_78[3] = 0xffffffffffffffff;
  local_78[5] = 1;
  local_78[6] = 2;
  local_78[7] = 3;
  if (maxOutputSize != 0) {
    puVar11 = (ushort *)(source + compressedSize);
    pcVar14 = dest + maxOutputSize;
    pcVar1 = pcVar14 + -8;
    puVar13 = (ushort *)source;
    pcVar16 = dest;
switchD_00139eb7_caseD_0:
    uVar4 = *puVar13;
    __src = (ushort *)((long)puVar13 + 1);
    uVar10 = (uint)(byte)((byte)uVar4 >> 4);
    __n_00 = (size_t)uVar10;
    if (uVar10 == 0xf) {
      __n_00 = 0xf;
      do {
        uVar5 = *__src;
        __src = (ushort *)((long)__src + 1);
        __n_00 = __n_00 + (byte)uVar5;
        if ((ushort *)((long)puVar11 - 0xfU) <= __src) break;
      } while ((byte)uVar5 == 0xff);
      if (-1 < (long)__n_00) goto LAB_00139c9e;
LAB_00139d70:
      puVar13 = __src;
      __dest = pcVar16;
      uVar7 = 6;
    }
    else {
LAB_00139c9e:
      __dest = pcVar16 + __n_00;
      puVar13 = (ushort *)((long)__src + __n_00);
      if ((dest + (long)maxOutputSize + -0xc < __dest) || (puVar11 + -4 < puVar13)) {
        if ((puVar13 != puVar11) || (pcVar14 < __dest)) goto LAB_00139d70;
        memcpy(pcVar16,__src,__n_00);
        uVar7 = 3;
      }
      else {
        do {
          *(undefined8 *)pcVar16 = *(undefined8 *)__src;
          pcVar16 = pcVar16 + 8;
          __src = __src + 4;
        } while (pcVar16 < __dest);
        pcVar16 = __dest + -(ulong)*puVar13;
        puVar13 = puVar13 + 1;
        uVar6 = 6;
        if ((0xffff < (uint)dictSize) || (uVar7 = uVar6, dest + -(long)dictSize <= pcVar16)) {
          uVar12 = (ulong)((byte)uVar4 & 0xf);
          if (uVar12 == 0xf) {
            uVar12 = 0xf;
            do {
              if ((ushort *)((long)puVar11 - 5U) < puVar13) {
                uVar7 = 6;
                bVar18 = false;
                goto LAB_00139d7f;
              }
              uVar4 = *puVar13;
              puVar13 = (ushort *)((long)puVar13 + 1);
              uVar12 = uVar12 + (byte)uVar4;
            } while ((ulong)(byte)uVar4 == 0xff);
            bVar18 = -1 < (long)uVar12;
            uVar7 = 6;
            if (bVar18) {
              uVar7 = 0;
            }
LAB_00139d7f:
            if (!bVar18) goto LAB_00139ea5;
          }
          pcVar17 = __dest + uVar12 + 4;
          if (pcVar16 < dest) {
            uVar7 = uVar6;
            if (pcVar17 <= pcVar14 + -5) {
              uVar12 = uVar12 + 4;
              __n_01 = (long)dest - (long)pcVar16;
              __n = uVar12 - __n_01;
              if (uVar12 < __n_01 || __n == 0) {
                memmove(__dest,dictStart + ((long)dictSize - __n_01),uVar12);
              }
              else {
                memcpy(__dest,dictStart + ((long)dictSize - __n_01),__n_01);
                __dest = __dest + __n_01;
                if ((ulong)((long)__dest - (long)dest) < __n) {
                  pcVar16 = dest;
                  uVar7 = 2;
                  if ((long)__n_01 < (long)uVar12) {
                    do {
                      *__dest = *pcVar16;
                      __dest = __dest + 1;
                      pcVar16 = pcVar16 + 1;
                      uVar7 = 2;
                    } while (__dest < pcVar17);
                  }
                  goto LAB_00139ea5;
                }
                memcpy(__dest,dest,__n);
              }
              __dest = pcVar17;
              uVar7 = 2;
            }
          }
          else {
            lVar15 = (long)__dest - (long)pcVar16;
            if (lVar15 < 8) {
              lVar3 = *(long *)(&DAT_0014c2e0 + lVar15 * 8);
              pcVar8 = pcVar16 + (lVar3 - local_78[lVar15]);
              *__dest = *pcVar16;
              __dest[1] = pcVar16[1];
              __dest[2] = pcVar16[2];
              __dest[3] = pcVar16[3];
              *(undefined4 *)(__dest + 4) = *(undefined4 *)(pcVar16 + lVar3);
            }
            else {
              *(undefined8 *)__dest = *(undefined8 *)pcVar16;
              pcVar8 = pcVar16 + 8;
            }
            __dest = __dest + 8;
            if (dest + (long)maxOutputSize + -0xc < pcVar17) {
              uVar7 = uVar6;
              if (pcVar17 <= pcVar14 + -5) {
                pcVar16 = pcVar8;
                pcVar9 = __dest;
                if (__dest < pcVar1) {
                  do {
                    *(undefined8 *)pcVar9 = *(undefined8 *)pcVar16;
                    pcVar9 = pcVar9 + 8;
                    pcVar16 = pcVar16 + 8;
                  } while (pcVar9 < pcVar1);
                  pcVar8 = pcVar8 + ((long)pcVar1 - (long)__dest);
                  pcVar9 = pcVar1;
                }
                for (; __dest = pcVar17, uVar7 = 0, pcVar9 < pcVar17; pcVar9 = pcVar9 + 1) {
                  cVar2 = *pcVar8;
                  pcVar8 = pcVar8 + 1;
                  *pcVar9 = cVar2;
                }
              }
            }
            else {
              do {
                *(undefined8 *)__dest = *(undefined8 *)pcVar8;
                __dest = __dest + 8;
                pcVar8 = pcVar8 + 8;
              } while (__dest < pcVar17);
              __dest = pcVar17;
              uVar7 = 0;
            }
          }
        }
      }
    }
LAB_00139ea5:
    pcVar16 = __dest;
    switch(uVar7) {
    case 0:
    case 2:
      goto switchD_00139eb7_caseD_0;
    default:
      goto switchD_00139eb7_caseD_1;
    case 3:
      __dest = (char *)(ulong)(uint)((int)__dest - (int)dest);
      goto LAB_00139f64;
    case 6:
      local_b8 = (int)source;
      __dest = (char *)(ulong)(~(uint)puVar13 + local_b8);
      goto LAB_00139f64;
    }
  }
  __dest = (char *)0xffffffff;
  if (compressedSize == 1) {
    __dest = (char *)(ulong)-(uint)(*source != '\0');
  }
LAB_00139f64:
  return (int)__dest;
switchD_00139eb7_caseD_1:
  goto LAB_00139f64;
}

Assistant:

FORCE_INLINE int LZ4_decompress_generic(
                 const char* const source,
                 char* const dest,
                 int inputSize,
                 int outputSize,         /* If endOnInput==endOnInputSize, this value is the max size of Output Buffer. */

                 int endOnInput,         /* endOnOutputSize, endOnInputSize */
                 int partialDecoding,    /* full, partial */
                 int targetOutputSize,   /* only used if partialDecoding==partial */
                 int dict,               /* noDict, withPrefix64k, usingExtDict */
                 const BYTE* const lowPrefix,  /* == dest if dict == noDict */
                 const BYTE* const dictStart,  /* only if dict==usingExtDict */
                 const size_t dictSize         /* note : = 0 if noDict */
                 )
{
    /* Local Variables */
    const BYTE* ip = (const BYTE*) source;
    const BYTE* const iend = ip + inputSize;

    BYTE* op = (BYTE*) dest;
    BYTE* const oend = op + outputSize;
    BYTE* cpy;
    BYTE* oexit = op + targetOutputSize;
    const BYTE* const lowLimit = lowPrefix - dictSize;

    const BYTE* const dictEnd = (const BYTE*)dictStart + dictSize;
    const size_t dec32table[] = {4, 1, 2, 1, 4, 4, 4, 4};
    const size_t dec64table[] = {0, 0, 0, (size_t)-1, 0, 1, 2, 3};

    const int safeDecode = (endOnInput==endOnInputSize);
    const int checkOffset = ((safeDecode) && (dictSize < (int)(64 KB)));


    /* Special cases */
    if ((partialDecoding) && (oexit> oend-MFLIMIT)) oexit = oend-MFLIMIT;                         /* targetOutputSize too high => decode everything */
    if ((endOnInput) && (unlikely(outputSize==0))) return ((inputSize==1) && (*ip==0)) ? 0 : -1;  /* Empty output buffer */
    if ((!endOnInput) && (unlikely(outputSize==0))) return (*ip==0?1:-1);


    /* Main Loop */
    while (1)
    {
        unsigned token;
        size_t length;
        const BYTE* match;

        /* get literal length */
        token = *ip++;
        if ((length=(token>>ML_BITS)) == RUN_MASK)
        {
            unsigned s;
            do
            {
                s = *ip++;
                length += s;
            }
            while (likely((endOnInput)?ip<iend-RUN_MASK:1) && (s==255));
            if ((safeDecode) && unlikely((size_t)(op+length)<(size_t)(op))) goto _output_error;   /* overflow detection */
            if ((safeDecode) && unlikely((size_t)(ip+length)<(size_t)(ip))) goto _output_error;   /* overflow detection */
        }

        /* copy literals */
        cpy = op+length;
        if (((endOnInput) && ((cpy>(partialDecoding?oexit:oend-MFLIMIT)) || (ip+length>iend-(2+1+LASTLITERALS))) )
            || ((!endOnInput) && (cpy>oend-COPYLENGTH)))
        {
            if (partialDecoding)
            {
                if (cpy > oend) goto _output_error;                           /* Error : write attempt beyond end of output buffer */
                if ((endOnInput) && (ip+length > iend)) goto _output_error;   /* Error : read attempt beyond end of input buffer */
            }
            else
            {
                if ((!endOnInput) && (cpy != oend)) goto _output_error;       /* Error : block decoding must stop exactly there */
                if ((endOnInput) && ((ip+length != iend) || (cpy > oend))) goto _output_error;   /* Error : input must be consumed */
            }
            memcpy(op, ip, length);
            ip += length;
            op += length;
            break;     /* Necessarily EOF, due to parsing restrictions */
        }
        LZ4_wildCopy(op, ip, cpy);
        ip += length; op = cpy;

        /* get offset */
        match = cpy - LZ4_readLE16(ip); ip+=2;
        if ((checkOffset) && (unlikely(match < lowLimit))) goto _output_error;   /* Error : offset outside destination buffer */

        /* get matchlength */
        length = token & ML_MASK;
        if (length == ML_MASK)
        {
            unsigned s;
            do
            {
                if ((endOnInput) && (ip > iend-LASTLITERALS)) goto _output_error;
                s = *ip++;
                length += s;
            } while (s==255);
            if ((safeDecode) && unlikely((size_t)(op+length)<(size_t)op)) goto _output_error;   /* overflow detection */
        }
        length += MINMATCH;

        /* check external dictionary */
        if ((dict==usingExtDict) && (match < lowPrefix))
        {
            if (unlikely(op+length > oend-LASTLITERALS)) goto _output_error;   /* doesn't respect parsing restriction */

            if (length <= (size_t)(lowPrefix-match))
            {
                /* match can be copied as a single segment from external dictionary */
                match = dictEnd - (lowPrefix-match);
                memmove(op, match, length); op += length;
            }
            else
            {
                /* match encompass external dictionary and current segment */
                size_t copySize = (size_t)(lowPrefix-match);
                memcpy(op, dictEnd - copySize, copySize);
                op += copySize;
                copySize = length - copySize;
                if (copySize > (size_t)(op-lowPrefix))   /* overlap within current segment */
                {
                    BYTE* const endOfMatch = op + copySize;
                    const BYTE* copyFrom = lowPrefix;
                    while (op < endOfMatch) *op++ = *copyFrom++;
                }
                else
                {
                    memcpy(op, lowPrefix, copySize);
                    op += copySize;
                }
            }
            continue;
        }

        /* copy repeated sequence */
        cpy = op + length;
        if (unlikely((op-match)<8))
        {
            const size_t dec64 = dec64table[op-match];
            op[0] = match[0];
            op[1] = match[1];
            op[2] = match[2];
            op[3] = match[3];
            match += dec32table[op-match];
            LZ4_copy4(op+4, match);
            op += 8; match -= dec64;
        } else { LZ4_copy8(op, match); op+=8; match+=8; }

        if (unlikely(cpy>oend-12))
        {
            if (cpy > oend-LASTLITERALS) goto _output_error;    /* Error : last LASTLITERALS bytes must be literals */
            if (op < oend-8)
            {
                LZ4_wildCopy(op, match, oend-8);
                match += (oend-8) - op;
                op = oend-8;
            }
            while (op<cpy) *op++ = *match++;
        }
        else
            LZ4_wildCopy(op, match, cpy);
        op=cpy;   /* correction */
    }

    /* end of decoding */
    if (endOnInput)
       return (int) (((char*)op)-dest);     /* Nb of output bytes decoded */
    else
       return (int) (((const char*)ip)-source);   /* Nb of input bytes read */

    /* Overflow error detected */
_output_error:
    return (int) (-(((const char*)ip)-source))-1;
}